

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)59,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = logic<(moira::Instr)59,(moira::Size)2>
                    (this,(uint)*(ushort *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58)
                     ,(uint)*(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58));
  prefetch<4ul>(this);
  *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (short)uVar1;
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}